

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

void __thiscall cppurses::Text_display::append(Text_display *this,Glyph_string *text)

{
  byte bVar1;
  pointer pGVar2;
  pointer pGVar3;
  long lVar4;
  Glyph *glyph;
  pointer __x;
  
  __x = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
        super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
        super__Vector_impl_data._M_start;
  pGVar2 = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar3 = __x;
  if (__x != pGVar2) {
    do {
      lVar4 = 0;
      do {
        bVar1 = (&Attribute_list)[lVar4];
        if (((this->insert_brush).attributes_.super__Base_bitset<1UL>._M_w >>
             ((long)(char)bVar1 & 0x3fU) & 1) != 0) {
          if (7 < bVar1) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                       (long)(char)bVar1,8);
          }
          (pGVar3->brush).attributes_.super__Base_bitset<1UL>._M_w =
               (pGVar3->brush).attributes_.super__Base_bitset<1UL>._M_w | 1L << (bVar1 & 0x3f);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      pGVar3 = pGVar3 + 1;
    } while (pGVar3 != pGVar2);
    for (; __x != pGVar2; __x = __x + 1) {
      std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::push_back
                (&(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>,
                 __x);
    }
  }
  (*(this->super_Widget)._vptr_Widget[3])(this);
  sig::
  Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
  ::operator()((Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                *)(this->contents_modified).pimpl_.
                  super___shared_ptr<sig::Signal_impl<void_(const_cppurses::Glyph_string_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(const_cppurses::Glyph_string_&)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&this->contents_);
  return;
}

Assistant:

void Text_display::append(Glyph_string text) {
    for (auto& glyph : text) {
        for (Attribute a : Attribute_list) {
            if (this->insert_brush.has_attribute(a)) {
                glyph.brush.add_attributes(a);
            }
        }
    }
    contents_.append(text);
    this->update();
    contents_modified(contents_);
}